

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_List.h
# Opt level: O2

void __thiscall
axl::sl::
OwningListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sys::lnx::ModuleDesc>_>
::clear(OwningListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::mem::Delete<axl::sys::lnx::ModuleDesc>_>
        *this)

{
  ModuleDesc *pMVar1;
  ModuleDesc *p;
  Delete<axl::sys::lnx::ModuleDesc> local_19;
  
  p = (this->
      super_ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
      ).super_ListData<axl::sys::lnx::ModuleDesc>.m_head;
  if (p != (ModuleDesc *)0x0) {
    while (p != (ModuleDesc *)0x0) {
      pMVar1 = (ModuleDesc *)(p->super_ListLink).m_next;
      mem::Delete<axl::sys::lnx::ModuleDesc>::operator()(&local_19,p);
      p = pMVar1;
    }
    (this->
    super_ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::sys::lnx::ModuleDesc>.m_head = (ModuleDesc *)0x0;
    (this->
    super_ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::sys::lnx::ModuleDesc>.m_tail = (ModuleDesc *)0x0;
    (this->
    super_ListBase<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>,_axl::sl::Iterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>,_axl::sl::ConstIterator<axl::sys::lnx::ModuleDesc,_axl::sl::ImplicitPtrCast<axl::sys::lnx::ModuleDesc,_axl::sl::ListLink>_>_>
    ).super_ListData<axl::sys::lnx::ModuleDesc>.m_count = 0;
  }
  return;
}

Assistant:

void
	clear() {
		if (!this->m_head)
			return;

		ListLink* link = GetLink()(this->m_head);
		while (link) {
			T* p = Iterator::getEntryFromLink(link);
			link = link->getNext();
			Delete()(p);
		}

		this->construct();
	}